

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O1

bool Internal_IsSubDFriendlyEnd
               (int endex,double *cubic_cpan_knots,ON_3dPoint *cv0,ON_3dPoint *cv1,ON_3dPoint *cv2)

{
  ON_3dPoint *p;
  ON_3dPoint *__return_storage_ptr__;
  double dVar1;
  ON_3dPoint Q;
  ON_3dPoint local_98;
  double local_80;
  ON_3dPoint local_78;
  ON_3dPoint local_58;
  ON_3dPoint local_40;
  
  if (endex == 0) {
    if (((*cubic_cpan_knots != cubic_cpan_knots[2]) ||
        (NAN(*cubic_cpan_knots) || NAN(cubic_cpan_knots[2]))) ||
       (cubic_cpan_knots[5] < cubic_cpan_knots[3] || cubic_cpan_knots[5] == cubic_cpan_knots[3]))
    goto LAB_0054a0bb;
    __return_storage_ptr__ = &local_40;
    operator*(__return_storage_ptr__,2.0,cv0);
    p = cv2;
  }
  else {
    if (((cubic_cpan_knots[2] < *cubic_cpan_knots || cubic_cpan_knots[2] == *cubic_cpan_knots) ||
        (cubic_cpan_knots[3] != cubic_cpan_knots[5])) ||
       (NAN(cubic_cpan_knots[3]) || NAN(cubic_cpan_knots[5]))) {
LAB_0054a0bb:
      ON_3dPoint::operator+(&local_58,cv0,cv2);
      operator*(&local_98,0.5,&local_58);
      goto LAB_0054a0e1;
    }
    operator*(&local_40,2.0,cv2);
    p = &local_40;
    __return_storage_ptr__ = cv0;
  }
  ON_3dPoint::operator+(&local_58,__return_storage_ptr__,p);
  ON_3dPoint::operator/(&local_98,&local_58,3.0);
LAB_0054a0e1:
  local_78.z = local_98.z;
  local_78.x = local_98.x;
  local_78.y = local_98.y;
  local_80 = ON_3dPoint::DistanceTo(cv0,cv2);
  local_80 = local_80 * 1e-06;
  dVar1 = ON_3dPoint::DistanceTo(cv1,&local_78);
  return dVar1 <= local_80;
}

Assistant:

static bool Internal_IsSubDFriendlyEnd(
  int endex,
  const double* cubic_cpan_knots,
  const ON_3dPoint& cv0,
  const ON_3dPoint& cv1,
  const ON_3dPoint& cv2
)
{
  ON_3dPoint Q;
  if (0 == endex)
  {
    Q = (cubic_cpan_knots[0] == cubic_cpan_knots[2] && cubic_cpan_knots[3] < cubic_cpan_knots[5])
      ? ((2.0*cv0 + cv2) / 3.0)
      : (0.5*(cv0 + cv2))
      ;
  }
  else
  {
    Q = (cubic_cpan_knots[0] < cubic_cpan_knots[2] && cubic_cpan_knots[3] == cubic_cpan_knots[5])
      ? ((cv0 + 2.0*cv2) / 3.0)
      : (0.5*(cv0 + cv2))
      ;
  }
  const double d = cv0.DistanceTo(cv2);
  const double tol = 1.0e-6*d;
  const double e = cv1.DistanceTo(Q);
  return (e <= tol);
}